

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecdsa_edge_cases(void)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  int iVar10;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  byte *pbVar15;
  secp256k1_context *psVar16;
  uchar *puVar17;
  long lVar18;
  int32_t ecount;
  size_t siglen;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar ss_2;
  secp256k1_scalar msg;
  uchar msg_3 [32];
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  int local_4164;
  size_t local_4160;
  undefined1 local_4158 [16];
  undefined1 auStack_4148 [16];
  undefined1 local_4138 [8];
  uint64_t uStack_4130;
  undefined1 auStack_4128 [16];
  secp256k1_scalar local_4118;
  undefined1 local_40f8 [8];
  uint64_t uStack_40f0;
  undefined1 local_40e8 [16];
  uchar local_40d8 [32];
  byte local_40b8 [32];
  secp256k1_ge local_4098;
  ulong local_4040;
  secp256k1_gej local_4038 [64];
  uint64_t auStack_2038 [1025];
  
  _local_4138 = ZEXT816(1);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_negate((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4138);
  secp256k1_scalar_inverse((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4138);
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,local_4038,(secp256k1_scalar *)local_4158);
  secp256k1_ge_set_gej(&local_4098,local_4038);
  local_40e8._0_8_ = auStack_4128._0_8_;
  local_40e8._8_8_ = auStack_4128._8_8_;
  _local_40f8 = _local_4138;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_4098,
                      (secp256k1_scalar *)local_40f8);
  if (iVar10 != 0) goto LAB_00169638;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  local_4098.x.n[0] = 0;
  local_4098.x.n[1] = 0;
  local_4098.x.n[2] = 0;
  local_4098.x.n[3] = 0;
  _local_40f8 = ZEXT816(0);
  local_40e8._0_8_ = 0;
  local_40e8._8_8_ = 0;
  iVar10 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00184290,0x21);
  if (iVar10 == 0) goto LAB_0016963d;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_4098);
  if (iVar10 != 0) goto LAB_00169642;
  local_4098.x.n[1] = 0;
  local_4098.x.n[2] = 0;
  local_4098.x.n[3] = 0;
  local_4098.x.n[0] = 2;
  local_4098.x.n[4]._0_1_ = 1;
  auStack_4128 = ZEXT816(0);
  _local_4138 = ZEXT816(0);
  _local_40f8 = ZEXT816(0);
  local_40e8._0_8_ = 0;
  local_40e8._8_8_ = 0;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  iVar10 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)&local_4098,0x21);
  if (iVar10 == 0) goto LAB_00169647;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar10 != 0) goto LAB_0016964c;
  local_40e8._0_8_ = 0;
  local_40e8._8_8_ = 0;
  stack0xffffffffffffbf09 = ZEXT715(0);
  local_40f8[0] = 2;
  local_40d8[0] = '\x02';
  local_4118.d[0] = 2;
  local_4118.d[1] = 0;
  local_4118.d[2] = 0;
  local_4118.d[3] = 0;
  local_4158 = ZEXT816(0);
  auStack_4148 = ZEXT816(0);
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  iVar10 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,local_40f8,0x21);
  if (iVar10 == 0) goto LAB_00169651;
  iVar10 = secp256k1_eckey_pubkey_parse(&local_4098,&DAT_001842c0,0x21);
  if (iVar10 == 0) goto LAB_00169656;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 == 0) goto LAB_0016965b;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,&local_4098,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 == 0) goto LAB_00169660;
  secp256k1_scalar_negate(&local_4118,&local_4118);
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 == 0) goto LAB_00169665;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,&local_4098,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 == 0) goto LAB_0016966a;
  local_4118.d[0] = 1;
  local_4118.d[1] = 0;
  local_4118.d[2] = 0;
  local_4118.d[3] = 0;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 != 0) goto LAB_0016966f;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,&local_4118,&local_4098,
                      (secp256k1_scalar *)local_4158);
  if (iVar10 != 0) goto LAB_00169674;
  _local_4138 = ZEXT816(1);
  auStack_4128 = ZEXT816(0);
  _local_40f8 = ZEXT816(1);
  local_40e8._0_8_ = 0;
  local_40e8._8_8_ = 0;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4158,"",(int *)0x0);
  iVar10 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_001842f0,0x21);
  if (iVar10 == 0) goto LAB_00169679;
  iVar10 = secp256k1_eckey_pubkey_parse(&local_4098,&DAT_00184320,0x21);
  if (iVar10 == 0) goto LAB_0016967e;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar10 == 0) goto LAB_00169683;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_4098,
                      (secp256k1_scalar *)local_40f8);
  if (iVar10 == 0) goto LAB_00169688;
  secp256k1_scalar_negate((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4138);
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar10 == 0) goto LAB_0016968d;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_4098,
                      (secp256k1_scalar *)local_40f8);
  if (iVar10 == 0) goto LAB_00169692;
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4138);
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40f8);
  if (iVar10 != 0) goto LAB_00169697;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_4098,
                      (secp256k1_scalar *)local_40f8);
  if (iVar10 != 0) goto LAB_0016969c;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  local_4098.x.n[0] = 1;
  local_4098.x.n[1] = 0;
  local_4098.x.n[2] = 0;
  local_4098.x.n[3] = 0;
  secp256k1_scalar_negate((secp256k1_scalar *)&local_4098,(secp256k1_scalar *)&local_4098);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_40f8,"",(int *)0x0);
  iVar10 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00184350,0x21);
  if (iVar10 == 0) goto LAB_001696a1;
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_4098);
  if (iVar10 == 0) goto LAB_001696a6;
  secp256k1_scalar_negate((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4158);
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_4098);
  if (iVar10 == 0) goto LAB_001696ab;
  local_4158 = ZEXT816(3);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4158);
  iVar10 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_40f8,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_4098);
  psVar16 = CTX;
  if (iVar10 != 0) goto LAB_001696b0;
  local_4118.d[2]._0_1_ = '\0';
  local_4118.d[2]._1_1_ = '\0';
  local_4118.d[2]._2_1_ = '\0';
  local_4118.d[2]._3_1_ = '\0';
  local_4118.d[2]._4_1_ = '\0';
  local_4118.d[2]._5_1_ = '\0';
  local_4118.d[2]._6_1_ = '\0';
  local_4118.d[2]._7_1_ = '\0';
  local_4118.d[3]._0_1_ = '\0';
  local_4118.d[3]._1_1_ = '\0';
  local_4118.d[3]._2_1_ = '\0';
  local_4118.d[3]._3_1_ = '\0';
  local_4118.d[3]._4_1_ = '\0';
  local_4118.d[3]._5_1_ = '\0';
  local_4118.d[3]._6_1_ = '\0';
  local_4118.d[3]._7_1_ = '\x01';
  local_4118.d[0]._0_1_ = '\0';
  local_4118.d[0]._1_1_ = '\0';
  local_4118.d[0]._2_1_ = '\0';
  local_4118.d[0]._3_1_ = '\0';
  local_4118.d[0]._4_1_ = '\0';
  local_4118.d[0]._5_1_ = '\0';
  local_4118.d[0]._6_1_ = '\0';
  local_4118.d[0]._7_1_ = '\0';
  local_4118.d[1]._0_1_ = '\0';
  local_4118.d[1]._1_1_ = '\0';
  local_4118.d[1]._2_1_ = '\0';
  local_4118.d[1]._3_1_ = '\0';
  local_4118.d[1]._4_1_ = '\0';
  local_4118.d[1]._5_1_ = '\0';
  local_4118.d[1]._6_1_ = '\0';
  local_4118.d[1]._7_1_ = '\0';
  local_40b8[0x10] = 0xb8;
  local_40b8[0x11] = 0x12;
  local_40b8[0x12] = 0xe0;
  local_40b8[0x13] = 0xb;
  local_40b8[0x14] = 0x81;
  local_40b8[0x15] = 0x7a;
  local_40b8[0x16] = 0x77;
  local_40b8[0x17] = 0x62;
  local_40b8[0x18] = 0x65;
  local_40b8[0x19] = 0xdf;
  local_40b8[0x1a] = 0xdd;
  local_40b8[0x1b] = 0x31;
  local_40b8[0x1c] = 0xb9;
  local_40b8[0x1d] = 0x3e;
  local_40b8[0x1e] = 0x29;
  local_40b8[0x1f] = 0xa9;
  local_40b8[0] = 0x86;
  local_40b8[1] = 0x41;
  local_40b8[2] = 0x99;
  local_40b8[3] = 0x81;
  local_40b8[4] = 6;
  local_40b8[5] = 0x23;
  local_40b8[6] = 0x44;
  local_40b8[7] = 0x53;
  local_40b8[8] = 0xaa;
  local_40b8[9] = 0x5f;
  local_40b8[10] = 0x9d;
  local_40b8[0xb] = 0x6a;
  local_40b8[0xc] = 0x31;
  local_40b8[0xd] = 0x78;
  local_40b8[0xe] = 0xf4;
  local_40b8[0xf] = 0xf7;
  local_4164 = 0;
  if (secp256k1_context_static == CTX) goto LAB_001696b5;
  (CTX->illegal_callback).fn = counting_illegal_callback_fn;
  (psVar16->illegal_callback).data = &local_4164;
LAB_001686e6:
  iVar10 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,(uchar *)&local_4118,
                      precomputed_nonce_function,"");
  if (iVar10 == 0) {
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,(uchar *)&local_4118
                        ,precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar10 != 0) goto LAB_001696d3;
    local_40b8[0x1f] = 0xaa;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,(uchar *)&local_4118
                        ,precomputed_nonce_function,"");
    if (iVar10 != 1) goto LAB_001696d8;
    if (local_4164 != 0) goto LAB_001696dd;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)0x0,local_40b8,(uchar *)&local_4118,
                        precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar10 != 0) goto LAB_001696e2;
    if (local_4164 != 1) goto LAB_001696e7;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,(uchar *)0x0,
                        (uchar *)&local_4118,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    if (iVar10 != 0) goto LAB_001696ec;
    if (local_4164 != 2) goto LAB_001696f1;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,(uchar *)0x0,
                        precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar10 != 0) goto LAB_001696f6;
    if (local_4164 != 3) goto LAB_001696fb;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,(uchar *)&local_4118
                        ,precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar10 != 1) goto LAB_00169700;
    iVar10 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_40f8,(uchar *)&local_4118);
    if (iVar10 == 0) goto LAB_00169705;
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 4) goto LAB_0016970a;
    (*(CTX->illegal_callback).fn)("msghash32 != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 5) goto LAB_0016970f;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 6) goto LAB_00169714;
    iVar10 = secp256k1_ecdsa_verify
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,
                        (secp256k1_pubkey *)local_40f8);
    if (iVar10 == 0) goto LAB_00169719;
    if (local_4164 != 6) goto LAB_0016971e;
    _local_40f8 = ZEXT816(0);
    local_40e8._0_8_ = 0;
    local_40e8._8_8_ = 0;
    local_40d8[0] = '\0';
    local_40d8[1] = '\0';
    local_40d8[2] = '\0';
    local_40d8[3] = '\0';
    local_40d8[4] = '\0';
    local_40d8[5] = '\0';
    local_40d8[6] = '\0';
    local_40d8[7] = '\0';
    local_40d8[8] = '\0';
    local_40d8[9] = '\0';
    local_40d8[10] = '\0';
    local_40d8[0xb] = '\0';
    local_40d8[0xc] = '\0';
    local_40d8[0xd] = '\0';
    local_40d8[0xe] = '\0';
    local_40d8[0xf] = '\0';
    local_40d8[0x10] = '\0';
    local_40d8[0x11] = '\0';
    local_40d8[0x12] = '\0';
    local_40d8[0x13] = '\0';
    local_40d8[0x14] = '\0';
    local_40d8[0x15] = '\0';
    local_40d8[0x16] = '\0';
    local_40d8[0x17] = '\0';
    local_40d8[0x18] = '\0';
    local_40d8[0x19] = '\0';
    local_40d8[0x1a] = '\0';
    local_40d8[0x1b] = '\0';
    local_40d8[0x1c] = '\0';
    local_40d8[0x1d] = '\0';
    local_40d8[0x1e] = '\0';
    local_40d8[0x1f] = '\0';
    pcVar14 = "seckey != NULL";
    if ((CTX->ecmult_gen_ctx).built == 0) {
      pcVar14 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
    }
    (*(CTX->illegal_callback).fn)(pcVar14,(CTX->illegal_callback).data);
    if (local_4164 != 7) goto LAB_00169723;
    iVar10 = secp256k1_ecdsa_verify
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_40b8,
                        (secp256k1_pubkey *)local_40f8);
    if (iVar10 != 0) goto LAB_00169728;
    if (local_4164 != 8) goto LAB_0016972d;
    local_4160 = 0x48;
    (*(CTX->illegal_callback).fn)("output != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 9) goto LAB_00169732;
    (*(CTX->illegal_callback).fn)("outputlen != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 10) goto LAB_00169737;
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 0xb) goto LAB_0016973c;
    iVar10 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,&local_4160,(secp256k1_ecdsa_signature *)&local_4098
                       );
    if (iVar10 == 0) goto LAB_00169741;
    if (local_4164 != 0xb) goto LAB_00169746;
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 0xc) goto LAB_0016974b;
    (*(CTX->illegal_callback).fn)("input != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 0xd) goto LAB_00169750;
    iVar10 = secp256k1_ecdsa_signature_parse_der
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,(uchar *)local_4038,local_4160)
    ;
    if (iVar10 == 0) goto LAB_00169755;
    if (local_4164 != 0xd) goto LAB_0016975a;
    local_4160 = 10;
    iVar10 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,&local_4160,(secp256k1_ecdsa_signature *)&local_4098
                       );
    if (iVar10 != 0) goto LAB_0016975f;
    if (local_4164 != 0xd) goto LAB_00169764;
    local_4164 = 0;
    (*(CTX->illegal_callback).fn)("sigin != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 1) goto LAB_00169769;
    (*(CTX->illegal_callback).fn)("output64 != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 2) goto LAB_0016976e;
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 3) goto LAB_00169773;
    local_4138._1_7_ = local_4098.x.n[4]._1_7_;
    local_4138[0] = (undefined1)local_4098.x.n[4];
    local_4158._8_8_ = local_4098.x.n[1];
    local_4158._0_8_ = local_4098.x.n[0];
    auStack_4148._8_8_ = local_4098.x.n[3];
    auStack_4148._0_8_ = local_4098.x.n[2];
    uStack_4130 = local_4098.y.n[0];
    auStack_4128._8_8_ = local_4098.y.n[2];
    auStack_4128._0_8_ = local_4098.y.n[1];
    secp256k1_scalar_get_b32((uchar *)local_4038,(secp256k1_scalar *)local_4158);
    secp256k1_scalar_get_b32((uchar *)(local_4038[0].x.n + 4),(secp256k1_scalar *)local_4138);
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 4) goto LAB_00169778;
    (*(CTX->illegal_callback).fn)("input64 != NULL",(CTX->illegal_callback).data);
    if (local_4164 != 5) goto LAB_0016977d;
    iVar10 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,(uchar *)local_4038);
    if (iVar10 == 0) goto LAB_00169782;
    if (local_4164 != 5) goto LAB_00169787;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].y.n[2]._0_4_ = 0xffffffff;
    local_4038[0].y.n[2]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].y.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    iVar10 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,(uchar *)local_4038);
    psVar16 = CTX;
    if (iVar10 != 0) goto LAB_0016978c;
    if (local_4164 != 5) goto LAB_00169791;
    if (secp256k1_context_static == CTX) goto LAB_00169796;
    (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
    (psVar16->illegal_callback).data = (void *)0x0;
  }
  else {
    test_ecdsa_edge_cases_cold_9();
LAB_001696d3:
    test_ecdsa_edge_cases_cold_10();
LAB_001696d8:
    test_ecdsa_edge_cases_cold_11();
LAB_001696dd:
    test_ecdsa_edge_cases_cold_12();
LAB_001696e2:
    test_ecdsa_edge_cases_cold_13();
LAB_001696e7:
    test_ecdsa_edge_cases_cold_14();
LAB_001696ec:
    test_ecdsa_edge_cases_cold_15();
LAB_001696f1:
    test_ecdsa_edge_cases_cold_16();
LAB_001696f6:
    test_ecdsa_edge_cases_cold_17();
LAB_001696fb:
    test_ecdsa_edge_cases_cold_18();
LAB_00169700:
    test_ecdsa_edge_cases_cold_19();
LAB_00169705:
    test_ecdsa_edge_cases_cold_76();
LAB_0016970a:
    test_ecdsa_edge_cases_cold_20();
LAB_0016970f:
    test_ecdsa_edge_cases_cold_21();
LAB_00169714:
    test_ecdsa_edge_cases_cold_22();
LAB_00169719:
    test_ecdsa_edge_cases_cold_75();
LAB_0016971e:
    test_ecdsa_edge_cases_cold_23();
LAB_00169723:
    test_ecdsa_edge_cases_cold_24();
LAB_00169728:
    test_ecdsa_edge_cases_cold_25();
LAB_0016972d:
    test_ecdsa_edge_cases_cold_26();
LAB_00169732:
    test_ecdsa_edge_cases_cold_27();
LAB_00169737:
    test_ecdsa_edge_cases_cold_28();
LAB_0016973c:
    test_ecdsa_edge_cases_cold_29();
LAB_00169741:
    test_ecdsa_edge_cases_cold_74();
LAB_00169746:
    test_ecdsa_edge_cases_cold_30();
LAB_0016974b:
    test_ecdsa_edge_cases_cold_31();
LAB_00169750:
    test_ecdsa_edge_cases_cold_32();
LAB_00169755:
    test_ecdsa_edge_cases_cold_73();
LAB_0016975a:
    test_ecdsa_edge_cases_cold_33();
LAB_0016975f:
    test_ecdsa_edge_cases_cold_34();
LAB_00169764:
    test_ecdsa_edge_cases_cold_35();
LAB_00169769:
    test_ecdsa_edge_cases_cold_36();
LAB_0016976e:
    test_ecdsa_edge_cases_cold_37();
LAB_00169773:
    test_ecdsa_edge_cases_cold_38();
LAB_00169778:
    test_ecdsa_edge_cases_cold_39();
LAB_0016977d:
    test_ecdsa_edge_cases_cold_40();
LAB_00169782:
    test_ecdsa_edge_cases_cold_72();
LAB_00169787:
    test_ecdsa_edge_cases_cold_41();
LAB_0016978c:
    test_ecdsa_edge_cases_cold_42();
LAB_00169791:
    test_ecdsa_edge_cases_cold_43();
    psVar16 = extraout_RAX_00;
LAB_00169796:
    (*(psVar16->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar16->illegal_callback).data);
  }
  uVar11 = 0;
  do {
    puVar17 = "";
    if ((int)uVar11 == 0) {
      puVar17 = (uchar *)0x0;
    }
    _local_4138 = (undefined1  [16])0x0;
    auStack_4128._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_4128[0xf] = 1;
    local_4158._8_4_ = 0xffffffff;
    local_4158._0_8_ = 0xffffffffffffffff;
    local_4158._12_4_ = 0xffffffff;
    auStack_4148._8_4_ = 0xffffffff;
    auStack_4148._0_8_ = 0xffffffffffffffff;
    auStack_4148._12_4_ = 0xffffffff;
    local_4040 = uVar11;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_4138,local_4158,
                        (secp256k1_nonce_function)0x0,puVar17);
    if (iVar10 != 0) goto LAB_001695f2;
    lVar12 = 0;
    do {
      cVar9 = *(char *)((long)local_4098.x.n + lVar12);
      if (cVar9 != '\0') goto LAB_00168da0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168da0:
    if (cVar9 != '\0') goto LAB_001695f7;
    auStack_4148 = (undefined1  [16])0x0;
    local_4158 = (undefined1  [16])0x0;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_4138,local_4158,
                        (secp256k1_nonce_function)0x0,puVar17);
    if (iVar10 != 0) goto LAB_001695fc;
    lVar12 = 0;
    do {
      cVar9 = *(char *)((long)local_4098.x.n + lVar12);
      if (cVar9 != '\0') goto LAB_00168df3;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168df3:
    if (cVar9 != '\0') goto LAB_00169601;
    auStack_4148[0xf] = 1;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_4138,local_4158,
                        nonce_function_test_fail,puVar17);
    if (iVar10 != 0) goto LAB_00169606;
    lVar12 = 0;
    do {
      cVar9 = *(char *)((long)local_4098.x.n + lVar12);
      if (cVar9 != '\0') goto LAB_00168e3f;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168e3f:
    if (cVar9 != '\0') goto LAB_0016960b;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)&local_4098,local_4138,local_4158,
                        nonce_function_test_retry,puVar17);
    if (iVar10 != 1) goto LAB_00169610;
    lVar12 = 0;
    do {
      cVar9 = *(char *)((long)local_4098.x.n + lVar12);
      if (cVar9 != '\0') goto LAB_00168e8b;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168e8b:
    if (cVar9 == '\0') goto LAB_00169615;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4138,local_4158,
                        nonce_function_rfc6979,puVar17);
    if (iVar10 != 1) goto LAB_0016961a;
    lVar12 = 0;
    do {
      cVar9 = local_40f8[lVar12];
      if (cVar9 != '\0') goto LAB_00168ed4;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168ed4:
    if (cVar9 == '\0') goto LAB_0016961f;
    lVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_4098.x.n + lVar12);
      iVar10 = (uint)bVar1 - (uint)(byte)local_40f8[lVar12];
      if (bVar1 != local_40f8[lVar12]) goto LAB_00168f04;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    iVar10 = 0;
LAB_00168f04:
    if (iVar10 != 0) goto LAB_00169624;
    iVar10 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4138,local_4158,
                        (secp256k1_nonce_function)0x0,puVar17);
    if (iVar10 != 1) goto LAB_00169629;
    lVar12 = 0;
    do {
      cVar9 = local_40f8[lVar12];
      if (cVar9 != '\0') goto LAB_00168f49;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    cVar9 = '\0';
LAB_00168f49:
    if (cVar9 == '\0') goto LAB_0016962e;
    lVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_4098.x.n + lVar12);
      iVar10 = (uint)bVar1 - (uint)(byte)local_40f8[lVar12];
      if (bVar1 != local_40f8[lVar12]) goto LAB_00168f79;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x40);
    iVar10 = 0;
LAB_00168f79:
    if (iVar10 != 0) goto LAB_00169633;
    lVar12 = 0;
    lVar18 = 0;
    do {
      local_4138[0] = (char)lVar18;
      iVar10 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4138,local_4158,
                          (secp256k1_nonce_function)0x0,puVar17);
      if (iVar10 != 1) goto LAB_001695de;
      lVar13 = 0;
      do {
        cVar9 = local_40f8[lVar13];
        if (cVar9 != '\0') goto LAB_00168fc9;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      cVar9 = '\0';
LAB_00168fc9:
      if (cVar9 == '\0') goto LAB_001695e3;
      local_4038[0].x.n[lVar18 * 4 + 2] = local_40e8._0_8_;
      local_4038[0].y.n[lVar18 * 4 + -2] = local_40e8._8_8_;
      local_4038[0].x.n[lVar18 * 4] = (uint64_t)local_40f8;
      local_4038[0].x.n[lVar18 * 4 + 1] = uStack_40f0;
      if (lVar18 != 0) {
        lVar13 = 0;
        do {
          if ((((local_4038[0].x.n[lVar18 * 4] == *(uint64_t *)((long)local_4038[0].x.n + lVar13))
               && (local_4038[0].x.n[lVar18 * 4 + 1] ==
                   *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 8))) &&
              (local_4038[0].x.n[lVar18 * 4 + 2] ==
               *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 0x10))) &&
             (local_4038[0].y.n[lVar18 * 4 + -2] ==
              *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 0x18))) goto LAB_001695d9;
          lVar13 = lVar13 + 0x20;
        } while (lVar12 != lVar13);
      }
      lVar18 = lVar18 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar18 != 0x100);
    auVar7[0xf] = 0;
    auVar7._0_15_ = stack0xffffffffffffbec9;
    _local_4138 = auVar7 << 8;
    auStack_4128[0xf] = 2;
    lVar18 = 0x100;
    lVar12 = 0x2000;
    do {
      local_4158[0] = (char)lVar18;
      iVar10 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40f8,local_4138,local_4158,
                          (secp256k1_nonce_function)0x0,puVar17);
      if (iVar10 != 1) goto LAB_001695e8;
      lVar13 = 0;
      do {
        cVar9 = local_40f8[lVar13];
        if (cVar9 != '\0') goto LAB_001690bb;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x40);
      cVar9 = '\0';
LAB_001690bb:
      if (cVar9 == '\0') goto LAB_001695ed;
      local_4038[0].x.n[lVar18 * 4] = (uint64_t)local_40f8;
      local_4038[0].x.n[lVar18 * 4 + 1] = uStack_40f0;
      local_4038[0].x.n[lVar18 * 4 + 2] = local_40e8._0_8_;
      local_4038[0].y.n[lVar18 * 4 + -2] = local_40e8._8_8_;
      lVar13 = 0;
      do {
        if (((local_4038[0].x.n[lVar18 * 4] == *(uint64_t *)((long)local_4038[0].x.n + lVar13)) &&
            (local_4038[0].x.n[lVar18 * 4 + 1] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 8))) &&
           ((local_4038[0].x.n[lVar18 * 4 + 2] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 0x10) &&
            (local_4038[0].y.n[lVar18 * 4 + -2] ==
             *(uint64_t *)((long)local_4038[0].x.n + lVar13 + 0x18))))) {
          test_ecdsa_edge_cases_cold_58();
LAB_001695d9:
          test_ecdsa_edge_cases_cold_56();
          goto LAB_001695de;
        }
        lVar13 = lVar13 + 0x20;
      } while (lVar12 != lVar13);
      lVar18 = lVar18 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar18 != 0x200);
    uVar11 = (ulong)((int)local_4040 + 1);
  } while ((int)local_4040 == 0);
  puVar17 = local_40f8;
  local_40e8 = (undefined1  [16])0x0;
  _local_40f8 = (undefined1  [16])0x0;
  lVar12 = 0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uStack_4130;
  _local_4138 = auVar8 << 0x40;
  local_4118.d[0] = 0;
  local_40b8[0] = 0;
  local_40b8[1] = 0;
  local_40b8[2] = 0;
  local_40b8[3] = 0;
  local_40b8[4] = 0;
  local_40b8[5] = 0;
  local_40b8[6] = 0;
  local_40b8[7] = 0;
  local_4038[0].x.n[0] = 0x4d430001;
  local_4038[0].x.n[1] = (uint64_t)local_40b8;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].y.n[0] = 0;
  local_4160 = 0;
  nonce_function_rfc6979(local_4158,puVar17,puVar17,(uchar *)0x0,(void *)0x0,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].y.n[0] = 0;
  local_4160 = 0;
  local_4038[0].x.n[1] = (uint64_t)local_4158;
  nonce_function_rfc6979(local_4138,puVar17,puVar17,puVar17,(void *)0x0,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].y.n[0] = 0;
  local_4160 = 0;
  local_4038[0].x.n[1] = (uint64_t)local_4138;
  nonce_function_rfc6979((uchar *)&local_4118,puVar17,puVar17,(uchar *)0x0,puVar17,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].y.n[0] = 0;
  local_4160 = 0;
  pbVar15 = local_40b8;
  local_4038[0].x.n[1] = (uint64_t)&local_4118;
  nonce_function_rfc6979(local_40b8,puVar17,puVar17,puVar17,puVar17,0);
  local_4038[0].x.n[0] = 0x4d430005;
  local_4038[0].x.n[1] = (uint64_t)local_40b8;
  local_4038[0].x.n[2] = 0x20;
  local_4038[0].x.n[3] = 0;
  local_4038[0].x.n[4] = 0;
  local_4038[0].y.n[0] = 0;
  uVar11 = (ulong)((long)pbVar15 << 3) >> 0x33;
  uVar3 = (((long)pbVar15 << 3 | (ulong)pbVar15 >> 0x3d) << 0xd | uVar11) >> 3;
  psVar16 = (secp256k1_context *)(uVar3 << 0x33 | (uVar11 << 0x3d | uVar3) >> 0xd);
  local_4160 = 0;
  do {
    iVar10 = (uint)(byte)local_4158[lVar12] - (uint)(byte)local_4138[lVar12];
    if (local_4158[lVar12] != local_4138[lVar12]) goto LAB_00169458;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  iVar10 = 0;
LAB_00169458:
  if (iVar10 == 0) {
    test_ecdsa_edge_cases_cold_66();
LAB_001697b4:
    test_ecdsa_edge_cases_cold_65();
LAB_001697b9:
    test_ecdsa_edge_cases_cold_64();
LAB_001697be:
    test_ecdsa_edge_cases_cold_63();
LAB_001697c3:
    test_ecdsa_edge_cases_cold_62();
LAB_001697c8:
    test_ecdsa_edge_cases_cold_61();
  }
  else {
    lVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_4118.d + lVar12);
      psVar16 = (secp256k1_context *)(ulong)bVar1;
      iVar10 = (uint)(byte)local_4158[lVar12] - (uint)bVar1;
      if (local_4158[lVar12] != bVar1) goto LAB_00169485;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar10 = 0;
LAB_00169485:
    if (iVar10 == 0) goto LAB_001697b4;
    lVar12 = 0;
    do {
      bVar1 = local_40b8[lVar12];
      psVar16 = (secp256k1_context *)(ulong)bVar1;
      iVar10 = (uint)(byte)local_4158[lVar12] - (uint)bVar1;
      if (local_4158[lVar12] != bVar1) goto LAB_001694b5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar10 = 0;
LAB_001694b5:
    if (iVar10 == 0) goto LAB_001697b9;
    lVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_4118.d + lVar12);
      psVar16 = (secp256k1_context *)(ulong)bVar1;
      iVar10 = (uint)(byte)local_4138[lVar12] - (uint)bVar1;
      if (local_4138[lVar12] != bVar1) goto LAB_001694e2;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar10 = 0;
LAB_001694e2:
    if (iVar10 == 0) goto LAB_001697be;
    lVar12 = 0;
    do {
      bVar1 = local_40b8[lVar12];
      psVar16 = (secp256k1_context *)(ulong)bVar1;
      iVar10 = (uint)(byte)local_4138[lVar12] - (uint)bVar1;
      if (local_4138[lVar12] != bVar1) goto LAB_00169512;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar10 = 0;
LAB_00169512:
    if (iVar10 == 0) goto LAB_001697c3;
    lVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_4118.d + lVar12);
      bVar2 = local_40b8[lVar12];
      psVar16 = (secp256k1_context *)(ulong)bVar2;
      iVar10 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00169542;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar10 = 0;
LAB_00169542:
    if (iVar10 == 0) goto LAB_001697c8;
    local_40e8[8] = 0xbf;
    local_40e8[9] = 0xd2;
    local_40e8[10] = '^';
    local_40e8[0xb] = 0x8c;
    local_40e8[0xc] = 0xd0;
    local_40e8[0xd] = '6';
    local_40e8[0xe] = 'A';
    local_40e8[0xf] = 'A';
    local_40e8[0] = 0xba;
    local_40e8[1] = 0xae;
    local_40e8[2] = 0xdc;
    local_40e8[3] = 0xe6;
    local_40e8[4] = 0xaf;
    local_40e8[5] = 'H';
    local_40e8[6] = 0xa0;
    local_40e8[7] = ';';
    uStack_40f0._0_1_ = 0xff;
    uStack_40f0._1_1_ = 0xff;
    uStack_40f0._2_1_ = 0xff;
    uStack_40f0._3_1_ = 0xff;
    uStack_40f0._4_1_ = 0xff;
    uStack_40f0._5_1_ = 0xff;
    uStack_40f0._6_1_ = 0xff;
    uStack_40f0._7_1_ = 0xfe;
    local_40f8[0] = 0xff;
    local_40f8[1] = 0xff;
    local_40f8[2] = 0xff;
    local_40f8[3] = 0xff;
    local_40f8[4] = 0xff;
    local_40f8[5] = 0xff;
    local_40f8[6] = 0xff;
    local_40f8[7] = 0xff;
    local_4158._0_8_ = 300;
    puVar17 = (uchar *)0x0;
    psVar16 = CTX;
    iVar10 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_40f8,0);
    if (iVar10 == 0) {
      local_4158._0_8_ = 300;
      puVar17 = (uchar *)0x1;
      psVar16 = CTX;
      iVar10 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_40f8,1);
      if (iVar10 == 0) {
        return;
      }
      goto LAB_001697d2;
    }
  }
  test_ecdsa_edge_cases_cold_59();
LAB_001697d2:
  test_ecdsa_edge_cases_cold_60();
  uVar4 = *(undefined8 *)puVar17;
  uVar5 = *(uint64_t *)(puVar17 + 8);
  uVar6 = *(uint64_t *)(puVar17 + 0x18);
  (psVar16->ecmult_gen_ctx).blind.d[1] = *(uint64_t *)(puVar17 + 0x10);
  (psVar16->ecmult_gen_ctx).blind.d[2] = uVar6;
  *(undefined8 *)&psVar16->ecmult_gen_ctx = uVar4;
  (psVar16->ecmult_gen_ctx).blind.d[0] = uVar5;
  return;
LAB_001695de:
  test_ecdsa_edge_cases_cold_55();
LAB_001695e3:
  test_ecdsa_edge_cases_cold_68();
LAB_001695e8:
  test_ecdsa_edge_cases_cold_57();
LAB_001695ed:
  test_ecdsa_edge_cases_cold_67();
LAB_001695f2:
  test_ecdsa_edge_cases_cold_44();
LAB_001695f7:
  test_ecdsa_edge_cases_cold_45();
LAB_001695fc:
  test_ecdsa_edge_cases_cold_46();
LAB_00169601:
  test_ecdsa_edge_cases_cold_47();
LAB_00169606:
  test_ecdsa_edge_cases_cold_48();
LAB_0016960b:
  test_ecdsa_edge_cases_cold_49();
LAB_00169610:
  test_ecdsa_edge_cases_cold_50();
LAB_00169615:
  test_ecdsa_edge_cases_cold_71();
LAB_0016961a:
  test_ecdsa_edge_cases_cold_51();
LAB_0016961f:
  test_ecdsa_edge_cases_cold_70();
LAB_00169624:
  test_ecdsa_edge_cases_cold_52();
LAB_00169629:
  test_ecdsa_edge_cases_cold_53();
LAB_0016962e:
  test_ecdsa_edge_cases_cold_69();
LAB_00169633:
  test_ecdsa_edge_cases_cold_54();
LAB_00169638:
  test_ecdsa_edge_cases_cold_1();
LAB_0016963d:
  test_ecdsa_edge_cases_cold_93();
LAB_00169642:
  test_ecdsa_edge_cases_cold_2();
LAB_00169647:
  test_ecdsa_edge_cases_cold_92();
LAB_0016964c:
  test_ecdsa_edge_cases_cold_3();
LAB_00169651:
  test_ecdsa_edge_cases_cold_91();
LAB_00169656:
  test_ecdsa_edge_cases_cold_90();
LAB_0016965b:
  test_ecdsa_edge_cases_cold_89();
LAB_00169660:
  test_ecdsa_edge_cases_cold_88();
LAB_00169665:
  test_ecdsa_edge_cases_cold_87();
LAB_0016966a:
  test_ecdsa_edge_cases_cold_86();
LAB_0016966f:
  test_ecdsa_edge_cases_cold_4();
LAB_00169674:
  test_ecdsa_edge_cases_cold_5();
LAB_00169679:
  test_ecdsa_edge_cases_cold_85();
LAB_0016967e:
  test_ecdsa_edge_cases_cold_84();
LAB_00169683:
  test_ecdsa_edge_cases_cold_83();
LAB_00169688:
  test_ecdsa_edge_cases_cold_82();
LAB_0016968d:
  test_ecdsa_edge_cases_cold_81();
LAB_00169692:
  test_ecdsa_edge_cases_cold_80();
LAB_00169697:
  test_ecdsa_edge_cases_cold_6();
LAB_0016969c:
  test_ecdsa_edge_cases_cold_7();
LAB_001696a1:
  test_ecdsa_edge_cases_cold_79();
LAB_001696a6:
  test_ecdsa_edge_cases_cold_78();
LAB_001696ab:
  test_ecdsa_edge_cases_cold_77();
LAB_001696b0:
  test_ecdsa_edge_cases_cold_8();
  psVar16 = extraout_RAX;
LAB_001696b5:
  (*(psVar16->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar16->illegal_callback).data);
  goto LAB_001686e6;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        int32_t ecount;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        ecount = 0;
        secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK(ecount == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, NULL) == 0);
        CHECK(ecount == 6);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK(ecount == 6);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, NULL) == 0);
        CHECK(ecount == 7);
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 0);
        CHECK(ecount == 8);
        siglen = 72;
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig) == 0);
        CHECK(ecount == 9);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig) == 0);
        CHECK(ecount == 10);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL) == 0);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen) == 0);
        CHECK(ecount == 12);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen) == 0);
        CHECK(ecount == 13);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        CHECK(ecount == 13);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK(ecount == 13);
        ecount = 0;
        CHECK(secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        CHECK(ecount == 5);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
        CHECK(ecount == 5);
        secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}